

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

string * __thiscall
soul::CompileMessage::getPositionString_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  LineAndColumn LVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  string local_38;
  
  if ((this->location).location.data == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"0:0",(allocator<char> *)&bStack_78);
  }
  else {
    LVar1 = CodeLocation::getLineAndColumn(&this->location);
    std::__cxx11::to_string(&local_38,LVar1.line);
    std::operator+(&bStack_78,&local_38,":");
    std::__cxx11::to_string(&local_58,LVar1.column);
    std::operator+(__return_storage_ptr__,&bStack_78,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getPositionString() const
{
    if (! hasPosition())
        return "0:0";

    auto lc = location.getLineAndColumn();
    return std::to_string (lc.line) + ":" + std::to_string (lc.column);
}